

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

void __thiscall
TPZVec<Fad<Fad<double>_>_>::Resize
          (TPZVec<Fad<Fad<double>_>_> *this,int64_t newsize,Fad<Fad<double>_> *object)

{
  undefined8 *puVar1;
  Vector<double> *this_00;
  Fad<Fad<double>_> *pFVar2;
  double dVar3;
  undefined1 auVar4 [16];
  Fad<Fad<double>_> *pFVar5;
  ulong uVar6;
  ulong uVar7;
  int64_t *piVar8;
  long lVar9;
  Vector<Fad<double>_> *this_01;
  Fad<double> *this_02;
  Fad<Fad<double>_> *pFVar10;
  long lVar11;
  long lVar12;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize.",0x26);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::ostream::flush();
    return;
  }
  lVar12 = this->fNElements;
  if (lVar12 != newsize) {
    if (newsize == 0) {
      pFVar10 = (Fad<Fad<double>_> *)0x0;
    }
    else {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = newsize;
      uVar6 = SUB168(auVar4 * ZEXT816(0x58),0);
      uVar7 = uVar6 + 8;
      if (0xfffffffffffffff7 < uVar6) {
        uVar7 = 0xffffffffffffffff;
      }
      uVar6 = 0xffffffffffffffff;
      if (SUB168(auVar4 * ZEXT816(0x58),8) == 0) {
        uVar6 = uVar7;
      }
      piVar8 = (int64_t *)operator_new__(uVar6);
      *piVar8 = newsize;
      pFVar10 = (Fad<Fad<double>_> *)(piVar8 + 1);
      lVar9 = 0;
      do {
        *(undefined8 *)((long)piVar8 + lVar9 + 0x10) = 0;
        *(undefined4 *)((long)piVar8 + lVar9 + 0x18) = 0;
        puVar1 = (undefined8 *)((long)piVar8 + lVar9 + 0x50);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)((long)piVar8 + lVar9 + 0x20);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined4 *)((long)piVar8 + lVar9 + 0x30) = 0;
        puVar1 = (undefined8 *)((long)piVar8 + lVar9 + 0x38);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined4 *)((long)piVar8 + lVar9 + 0x48) = 0;
        lVar9 = lVar9 + 0x58;
      } while (newsize * 0x58 - lVar9 != 0);
    }
    if (newsize <= lVar12) {
      lVar12 = newsize;
    }
    if (lVar12 < 1) {
      lVar12 = 0;
    }
    else {
      lVar11 = 0;
      lVar9 = lVar12;
      do {
        pFVar2 = this->fStore;
        this_00 = (Vector<double> *)((long)&(pFVar10->val_).dx_.num_elts + lVar11);
        this_00[-1].ptr_to_data = *(double **)((long)&(pFVar2->val_).val_ + lVar11);
        Vector<double>::operator=
                  (this_00,(Vector<double> *)((long)&(pFVar2->val_).dx_.num_elts + lVar11));
        *(undefined8 *)(this_00 + 1) = *(undefined8 *)((long)&(pFVar2->val_).defaultVal + lVar11);
        Vector<Fad<double>_>::operator=
                  ((Vector<Fad<double>_> *)((long)&(pFVar10->dx_).num_elts + lVar11),
                   (Vector<Fad<double>_> *)((long)&(pFVar2->dx_).num_elts + lVar11));
        *(undefined8 *)((long)&(pFVar10->defaultVal).val_ + lVar11) =
             *(undefined8 *)((long)&(pFVar2->defaultVal).val_ + lVar11);
        Vector<double>::operator=
                  ((Vector<double> *)((long)&(pFVar10->defaultVal).dx_.num_elts + lVar11),
                   (Vector<double> *)((long)&(pFVar2->defaultVal).dx_.num_elts + lVar11));
        *(undefined8 *)((long)&(pFVar10->defaultVal).defaultVal + lVar11) =
             *(undefined8 *)((long)&(pFVar2->defaultVal).defaultVal + lVar11);
        lVar11 = lVar11 + 0x58;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
    }
    lVar9 = newsize - lVar12;
    if (lVar9 != 0 && lVar12 <= newsize) {
      this_01 = &pFVar10[lVar12].dx_;
      do {
        *(double *)(this_01 + -2) = (object->val_).val_;
        Vector<double>::operator=((Vector<double> *)&this_01[-2].ptr_to_data,&(object->val_).dx_);
        this_01[-1].ptr_to_data = (Fad<double> *)(object->val_).defaultVal;
        Vector<Fad<double>_>::operator=(this_01,&object->dx_);
        *(double *)(this_01 + 1) = (object->defaultVal).val_;
        Vector<double>::operator=
                  ((Vector<double> *)&this_01[1].ptr_to_data,&(object->defaultVal).dx_);
        this_01[2].ptr_to_data = (Fad<double> *)(object->defaultVal).defaultVal;
        this_01 = (Vector<Fad<double>_> *)&this_01[5].ptr_to_data;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
    }
    pFVar2 = this->fStore;
    if (pFVar2 != (Fad<Fad<double>_> *)0x0) {
      dVar3 = pFVar2[-1].defaultVal.defaultVal;
      if (dVar3 != 0.0) {
        pFVar5 = pFVar2 + (long)dVar3 + -1;
        lVar12 = (long)dVar3 * -0x58;
        do {
          this_02 = &pFVar5->val_;
          Fad<double>::~Fad((Fad<double> *)((Vector<Fad<double>_> *)(this_02 + 1) + 1));
          Vector<Fad<double>_>::~Vector((Vector<Fad<double>_> *)(this_02 + 1));
          Fad<double>::~Fad(this_02);
          pFVar5 = (Fad<Fad<double>_> *)(this_02 + -3);
          lVar12 = lVar12 + 0x58;
        } while (lVar12 != 0);
      }
      operator_delete__(&pFVar2[-1].defaultVal.defaultVal,(long)dVar3 * 0x58 + 8);
    }
    this->fStore = pFVar10;
    this->fNElements = newsize;
    this->fNAlloc = newsize;
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize,const T& object) {
#ifndef PZNODEBUG
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize." << std::endl;
		PZError.flush();
		return;
	}
#endif
	if(newsize == fNElements) return;
	T* newstore;
	if(newsize) newstore = new T[newsize];
	else newstore = 0;
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	for(;i<newsize;i++) {   // then only to case : large=fNElement < newsize
		newstore[i] = object;
	}
    if(fStore) {
        delete[] fStore;
        fStore = nullptr;
    }
	fStore = newstore;
	fNElements = newsize;//cedric 20/11/99 e 29/04/00
    fNAlloc = newsize;
}